

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O3

void dwt(wt_object wt,double *inp)

{
  wt_object pwVar1;
  size_t __size;
  int iVar2;
  wave_object pwVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  wt_object sig;
  double *cA;
  wt_object pwVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  ulong local_40;
  ulong uVar7;
  
  local_40 = (ulong)wt->siglength;
  iVar2 = wt->J;
  lVar10 = (long)iVar2;
  wt->length[lVar10 + 1] = wt->siglength;
  wt->outlength = 0;
  wt->zpad = 0;
  __size = local_40 * 8;
  sig = (wt_object)malloc(__size);
  cA = (double *)malloc(__size);
  if (0 < (long)local_40) {
    memcpy(sig,inp,__size);
  }
  iVar6 = wt->wave->lpd_len;
  iVar4 = strcmp(wt->ext,"per");
  if (iVar4 == 0) {
    if (0 < iVar2) {
      iVar6 = 0;
      uVar7 = local_40;
      lVar9 = lVar10 + 0x16;
      do {
        dVar12 = ceil((double)(int)uVar7 * 0.5);
        uVar5 = (uint)dVar12;
        uVar7 = (ulong)uVar5;
        *(uint *)(wt->method + lVar9 * 4 + -0x10) = uVar5;
        iVar6 = iVar6 + uVar5;
        uVar11 = lVar9 - 0x16;
        lVar9 = lVar9 + -1;
      } while (1 < uVar11);
      iVar6 = iVar6 + wt->length[1];
      wt->length[0] = wt->length[1];
      wt->outlength = iVar6;
      if (0 < iVar2) {
        pwVar1 = wt + 1;
        lVar9 = 0;
        do {
          uVar5 = wt->length[lVar10 + lVar9];
          iVar6 = iVar6 - uVar5;
          iVar4 = strcmp(wt->cmethod,"fft");
          if ((iVar4 == 0) || (iVar4 = strcmp(wt->cmethod,"FFT"), iVar4 == 0)) {
            dwt1(wt,(double *)sig,(int)local_40,cA,
                 (double *)(pwVar1->method + (long)iVar6 * 8 + -0x10));
          }
          else {
            pwVar3 = wt->wave;
            dwt_per_stride((double *)sig,(int)local_40,pwVar3->lpd,pwVar3->hpd,pwVar3->lpd_len,cA,
                           uVar5,(double *)(pwVar1->method + (long)iVar6 * 8 + -0x10),1,1);
          }
          local_40 = (ulong)(uint)wt->length[lVar10 + lVar9];
          if (0 < (int)uVar5) {
            pwVar8 = sig;
            if (-(ulong)(iVar2 - 1) == lVar9) {
              pwVar8 = pwVar1;
            }
            memcpy(pwVar8,cA,(ulong)uVar5 << 3);
          }
          lVar9 = lVar9 + -1;
        } while (-lVar10 != lVar9);
      }
      goto LAB_0010301c;
    }
  }
  else {
    iVar4 = strcmp(wt->ext,"sym");
    if (iVar4 != 0) {
      printf("Signal extension can be either per or sym");
      exit(-1);
    }
    if (0 < iVar2) {
      iVar4 = 0;
      uVar7 = local_40;
      lVar9 = lVar10 + 0x16;
      do {
        dVar12 = ceil((double)((int)uVar7 + iVar6 + -2) * 0.5);
        uVar5 = (uint)dVar12;
        uVar7 = (ulong)uVar5;
        *(uint *)(wt->method + lVar9 * 4 + -0x10) = uVar5;
        iVar4 = iVar4 + uVar5;
        uVar11 = lVar9 - 0x16;
        lVar9 = lVar9 + -1;
      } while (1 < uVar11);
      iVar4 = iVar4 + wt->length[1];
      wt->length[0] = wt->length[1];
      wt->outlength = iVar4;
      if (0 < iVar2) {
        pwVar1 = wt + 1;
        lVar9 = 0;
        do {
          uVar5 = wt->length[lVar10 + lVar9];
          iVar4 = iVar4 - uVar5;
          iVar6 = strcmp(wt->cmethod,"fft");
          if ((iVar6 == 0) || (iVar6 = strcmp(wt->cmethod,"FFT"), iVar6 == 0)) {
            dwt1(wt,(double *)sig,(int)local_40,cA,
                 (double *)(pwVar1->method + (long)iVar4 * 8 + -0x10));
          }
          else {
            pwVar3 = wt->wave;
            dwt_sym_stride((double *)sig,(int)local_40,pwVar3->lpd,pwVar3->hpd,pwVar3->lpd_len,cA,
                           uVar5,(double *)(pwVar1->method + (long)iVar4 * 8 + -0x10),1,1);
          }
          local_40 = (ulong)(uint)wt->length[lVar10 + lVar9];
          if (0 < (int)uVar5) {
            pwVar8 = sig;
            if (-(ulong)(iVar2 - 1) == lVar9) {
              pwVar8 = pwVar1;
            }
            memcpy(pwVar8,cA,(ulong)uVar5 << 3);
          }
          lVar9 = lVar9 + -1;
        } while (-lVar10 != lVar9);
      }
      goto LAB_0010301c;
    }
  }
  iVar2 = wt->length[1];
  wt->length[0] = iVar2;
  wt->outlength = iVar2;
LAB_0010301c:
  free(sig);
  free(cA);
  return;
}

Assistant:

void dwt(wt_object wt,const double *inp) {
	int i,J,temp_len,iter,N,lp;
	int len_cA;
	double *orig,*orig2;

	temp_len = wt->siglength;
	J = wt->J;
	wt->length[J + 1] = temp_len;
	wt->outlength = 0;
	wt->zpad = 0;
	orig = (double*)malloc(sizeof(double)* temp_len);
	orig2 = (double*)malloc(sizeof(double)* temp_len);
	/*
	if ((temp_len % 2) == 0) {
	wt->zpad = 0;
	orig = (double*)malloc(sizeof(double)* temp_len);
	orig2 = (double*)malloc(sizeof(double)* temp_len);
	}
	else {
	wt->zpad = 1;
	temp_len++;
	orig = (double*)malloc(sizeof(double)* temp_len);
	orig2 = (double*)malloc(sizeof(double)* temp_len);
	}
	*/

	for (i = 0; i < wt->siglength; ++i) {
		orig[i] = inp[i];
	}

	if (wt->zpad == 1) {
		orig[temp_len - 1] = orig[temp_len - 2];
	}

	N = temp_len;
	lp = wt->wave->lpd_len;

	if (!strcmp(wt->ext,"per")) {
		i = J;
		while (i > 0) {
			N = (int)ceil((double)N / 2.0);
			wt->length[i] = N;
			wt->outlength += wt->length[i];
			i--;
		}
		wt->length[0] = wt->length[1];
		wt->outlength += wt->length[0];
		N = wt->outlength;

		for (iter = 0; iter < J; ++iter) {
			len_cA = wt->length[J - iter];
			N -= len_cA;
			if ( !strcmp(wt->cmethod, "fft") || !strcmp(wt->cmethod, "FFT") ) {
				dwt1(wt, orig, temp_len, orig2, wt->params + N);
			}
			else {
				dwt_per(wt, orig, temp_len, orig2, len_cA, wt->params + N);
			}
			temp_len = wt->length[J - iter];
			if (iter == J - 1) {
				for (i = 0; i < len_cA; ++i) {
					wt->params[i] = orig2[i];
				}
			}
			else {
				for (i = 0; i < len_cA; ++i) {
					orig[i] = orig2[i];
				}
			}
		}
	}
	else if (!strcmp(wt->ext,"sym")) {
		//printf("\n YES %s \n", wt->ext);
		i = J;
		while (i > 0) {
			N = N + lp - 2;
			N = (int) ceil((double)N / 2.0);
			wt->length[i] = N;
			wt->outlength += wt->length[i];
			i--;
		}
		wt->length[0] = wt->length[1];
		wt->outlength += wt->length[0];
		N = wt->outlength;

		for (iter = 0; iter < J; ++iter) {
			len_cA = wt->length[J - iter];
			N -= len_cA;
			if (!strcmp(wt->cmethod, "fft") || !strcmp(wt->cmethod, "FFT")) {
				dwt1(wt, orig, temp_len, orig2, wt->params + N);
			}
			else {
				dwt_sym(wt, orig, temp_len, orig2, len_cA, wt->params + N);
			}
			temp_len = wt->length[J - iter];

			if (iter == J - 1) {
				for (i = 0; i < len_cA; ++i) {
					wt->params[i] = orig2[i];
				}
			}
			else {
				for (i = 0; i < len_cA; ++i) {
					orig[i] = orig2[i];
				}
			}
		}
	}
	else {
		printf("Signal extension can be either per or sym");
		exit(-1);
	}

	free(orig);
	free(orig2);
}